

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O3

free_ptr<MARGINAL::data> scoped_calloc_or_throw<MARGINAL::data>(void)

{
  bool *pbVar1;
  data *__s;
  long lVar2;
  _Tuple_impl<1UL,_void_(*)(void_*)> in_RDI;
  free_ptr<MARGINAL::data> fVar3;
  
  __s = calloc_or_throw<MARGINAL::data>(1);
  memset(__s,0,0x69a0);
  lVar2 = 0x110;
  do {
    pbVar1 = __s->id_features + lVar2 + 0x42;
    pbVar1[0] = false;
    pbVar1[1] = false;
    pbVar1[2] = false;
    pbVar1[3] = false;
    pbVar1[4] = false;
    pbVar1[5] = false;
    pbVar1[6] = false;
    pbVar1[7] = false;
    pbVar1[8] = false;
    pbVar1[9] = false;
    pbVar1[10] = false;
    pbVar1[0xb] = false;
    pbVar1[0xc] = false;
    pbVar1[0xd] = false;
    pbVar1[0xe] = false;
    pbVar1[0xf] = false;
    pbVar1 = __s->id_features + lVar2 + 0x32;
    pbVar1[0] = false;
    pbVar1[1] = false;
    pbVar1[2] = false;
    pbVar1[3] = false;
    pbVar1[4] = false;
    pbVar1[5] = false;
    pbVar1[6] = false;
    pbVar1[7] = false;
    pbVar1[8] = false;
    pbVar1[9] = false;
    pbVar1[10] = false;
    pbVar1[0xb] = false;
    pbVar1[0xc] = false;
    pbVar1[0xd] = false;
    pbVar1[0xe] = false;
    pbVar1[0xf] = false;
    pbVar1 = __s->id_features + lVar2 + 0x22;
    pbVar1[0] = false;
    pbVar1[1] = false;
    pbVar1[2] = false;
    pbVar1[3] = false;
    pbVar1[4] = false;
    pbVar1[5] = false;
    pbVar1[6] = false;
    pbVar1[7] = false;
    pbVar1[8] = false;
    pbVar1[9] = false;
    pbVar1[10] = false;
    pbVar1[0xb] = false;
    pbVar1[0xc] = false;
    pbVar1[0xd] = false;
    pbVar1[0xe] = false;
    pbVar1[0xf] = false;
    pbVar1 = __s->id_features + lVar2 + 0x12;
    pbVar1[0] = false;
    pbVar1[1] = false;
    pbVar1[2] = false;
    pbVar1[3] = false;
    pbVar1[4] = false;
    pbVar1[5] = false;
    pbVar1[6] = false;
    pbVar1[7] = false;
    pbVar1[8] = false;
    pbVar1[9] = false;
    pbVar1[10] = false;
    pbVar1[0xb] = false;
    pbVar1[0xc] = false;
    pbVar1[0xd] = false;
    pbVar1[0xe] = false;
    pbVar1[0xf] = false;
    pbVar1 = __s->id_features + lVar2 + 2;
    pbVar1[0] = false;
    pbVar1[1] = false;
    pbVar1[2] = false;
    pbVar1[3] = false;
    pbVar1[4] = false;
    pbVar1[5] = false;
    pbVar1[6] = false;
    pbVar1[7] = false;
    pbVar1[8] = false;
    pbVar1[9] = false;
    pbVar1[10] = false;
    pbVar1[0xb] = false;
    pbVar1[0xc] = false;
    pbVar1[0xd] = false;
    pbVar1[0xe] = false;
    pbVar1[0xf] = false;
    pbVar1 = __s->id_features + lVar2 + -0xe;
    pbVar1[0] = false;
    pbVar1[1] = false;
    pbVar1[2] = false;
    pbVar1[3] = false;
    pbVar1[4] = false;
    pbVar1[5] = false;
    pbVar1[6] = false;
    pbVar1[7] = false;
    pbVar1[8] = false;
    pbVar1[9] = false;
    pbVar1[10] = false;
    pbVar1[0xb] = false;
    pbVar1[0xc] = false;
    pbVar1[0xd] = false;
    pbVar1[0xe] = false;
    pbVar1[0xf] = false;
    pbVar1 = __s->id_features + lVar2 + 0x52;
    pbVar1[0] = false;
    pbVar1[1] = false;
    pbVar1[2] = false;
    pbVar1[3] = false;
    lVar2 = lVar2 + 0x68;
  } while (lVar2 != 0x6910);
  (__s->marginals)._M_h._M_buckets = &(__s->marginals)._M_h._M_single_bucket;
  (__s->marginals)._M_h._M_bucket_count = 1;
  (__s->marginals)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__s->marginals)._M_h._M_element_count = 0;
  (__s->marginals)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (__s->marginals)._M_h._M_rehash_policy._M_next_resize = 0;
  (__s->marginals)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  fVar3._M_t.super___uniq_ptr_impl<MARGINAL::data,_void_(*)(void_*)>._M_t.
  super__Tuple_impl<0UL,_MARGINAL::data_*,_void_(*)(void_*)>.
  super__Head_base<0UL,_MARGINAL::data_*,_false>._M_head_impl =
       &(__s->expert_state)._M_h._M_single_bucket;
  (__s->expert_state)._M_h._M_buckets =
       fVar3._M_t.super___uniq_ptr_impl<MARGINAL::data,_void_(*)(void_*)>._M_t.
       super__Tuple_impl<0UL,_MARGINAL::data_*,_void_(*)(void_*)>.
       super__Head_base<0UL,_MARGINAL::data_*,_false>._M_head_impl;
  (__s->expert_state)._M_h._M_bucket_count = 1;
  (__s->expert_state)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__s->expert_state)._M_h._M_element_count = 0;
  (__s->expert_state)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (__s->expert_state)._M_h._M_rehash_policy._M_next_resize = 0;
  (__s->expert_state)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  *(code **)in_RDI.super__Head_base<1UL,_void_(*)(void_*),_false>._M_head_impl =
       destroy_free<MARGINAL::data>;
  *(data **)((long)in_RDI.super__Head_base<1UL,_void_(*)(void_*),_false>._M_head_impl + 8) = __s;
  fVar3._M_t.super___uniq_ptr_impl<MARGINAL::data,_void_(*)(void_*)>._M_t.
  super__Tuple_impl<0UL,_MARGINAL::data_*,_void_(*)(void_*)>.
  super__Tuple_impl<1UL,_void_(*)(void_*)>.super__Head_base<1UL,_void_(*)(void_*),_false>.
  _M_head_impl = in_RDI.super__Head_base<1UL,_void_(*)(void_*),_false>._M_head_impl;
  return (free_ptr<MARGINAL::data>)
         fVar3._M_t.super___uniq_ptr_impl<MARGINAL::data,_void_(*)(void_*)>._M_t.
         super__Tuple_impl<0UL,_MARGINAL::data_*,_void_(*)(void_*)>;
}

Assistant:

free_ptr<T> scoped_calloc_or_throw()
{
  T* temp = calloc_or_throw<T>(1);
  new (temp) T();
  return std::unique_ptr<T, free_fn>(temp, destroy_free<T>);
}